

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

void hash_destroy(HashTable *table)

{
  void *pvVar1;
  MOJOSHADER_free p_Var2;
  void *pvVar3;
  HashItem *pHVar4;
  HashItem *next;
  HashItem *item;
  void *d;
  MOJOSHADER_free f;
  void *data;
  uint32 i;
  HashTable *table_local;
  
  pvVar1 = table->data;
  p_Var2 = table->f;
  pvVar3 = table->d;
  for (data._4_4_ = 0; data._4_4_ < table->table_len; data._4_4_ = data._4_4_ + 1) {
    next = table->table[data._4_4_];
    while (next != (HashItem *)0x0) {
      pHVar4 = next->next;
      (*table->nuke)(next->key,next->value,pvVar1);
      (*p_Var2)(next,pvVar3);
      next = pHVar4;
    }
  }
  (*p_Var2)(table->table,pvVar3);
  (*p_Var2)(table,pvVar3);
  return;
}

Assistant:

void hash_destroy(HashTable *table)
{
    uint32 i;
    void *data = table->data;
    MOJOSHADER_free f = table->f;
    void *d = table->d;
    for (i = 0; i < table->table_len; i++)
    {
        HashItem *item = table->table[i];
        while (item != NULL)
        {
            HashItem *next = item->next;
            table->nuke(item->key, item->value, data);
            f(item, d);
            item = next;
        } // while
    } // for

    f(table->table, d);
    f(table, d);
}